

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_example.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::ApiExample::DealableQuotes
          (ApiExample *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *liquidity_providers)

{
  pointer pcVar1;
  long lVar2;
  string *psVar3;
  undefined8 *puVar4;
  Tenor *pTVar5;
  BulkSubscriber *pBVar6;
  pointer pbVar7;
  string lp;
  long *local_170 [2];
  long local_160 [2];
  long *local_150 [2];
  long local_140 [2];
  undefined8 local_130;
  undefined8 local_128;
  long *local_120 [2];
  long local_110 [2];
  ApiExample *local_100;
  code *local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  long *local_b8 [2];
  long local_a8 [2];
  pointer local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pbVar7 = (liquidity_providers->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_98 = (liquidity_providers->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 != local_98) {
    local_100 = this;
    do {
      local_150[0] = local_140;
      pcVar1 = (pbVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_150,pcVar1,pcVar1 + pbVar7->_M_string_length);
      pBVar6 = (local_100->subscriber_)._M_t.
               super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
               ._M_t.
               super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
               .super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>._M_head_impl;
      lVar2 = *(long *)pBVar6;
      pBVar6 = pBVar6 + *(long *)(lVar2 + -0x30);
      local_130 = (**(code **)(lVar2 + 0x38))();
      bidfx_public_api::price::subject::SubjectFactory::Fx();
      local_128 = bidfx_public_api::price::subject::SubjectFactory::FX::Quote();
      bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Spot();
      psVar3 = (string *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Spot::LiquidityProvider
                         ((string *)local_120);
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"EURUSD","");
      psVar3 = (string *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Spot::CurrencyPair(psVar3);
      local_170[0] = local_160;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"EUR","");
      bidfx_public_api::price::subject::SubjectFactory::FX::Spot::Currency(psVar3);
      puVar4 = (undefined8 *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Spot::Quantity(1000000.11);
      (**(code **)*puVar4)(&local_48,puVar4);
      (**(code **)(*(long *)pBVar6 + 8))(pBVar6,&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      if (local_170[0] != local_160) {
        operator_delete(local_170[0],local_160[0] + 1);
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
      local_f8 = __cxa_throw;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f0);
      pBVar6 = (local_100->subscriber_)._M_t.
               super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
               ._M_t.
               super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
               .super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>._M_head_impl;
      lVar2 = *(long *)pBVar6;
      pBVar6 = pBVar6 + *(long *)(lVar2 + -0x30);
      local_130 = (**(code **)(lVar2 + 0x38))();
      bidfx_public_api::price::subject::SubjectFactory::Fx();
      local_128 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
      bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Forward();
      psVar3 = (string *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Forward::LiquidityProvider
                         ((string *)local_b8);
      local_170[0] = local_160;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"EURUSD","");
      psVar3 = (string *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Forward::CurrencyPair(psVar3);
      local_120[0] = local_110;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"EUR","");
      bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Currency(psVar3);
      pTVar5 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Quantity
                                  (1000000.0);
      puVar4 = (undefined8 *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Tenor(pTVar5);
      (**(code **)*puVar4)(&local_60,puVar4);
      (**(code **)(*(long *)pBVar6 + 8))(pBVar6,&local_60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_60);
      if (local_120[0] != local_110) {
        operator_delete(local_120[0],local_110[0] + 1);
      }
      if (local_170[0] != local_160) {
        operator_delete(local_170[0],local_160[0] + 1);
      }
      local_f8 = __cxa_throw;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f0);
      pBVar6 = (local_100->subscriber_)._M_t.
               super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
               ._M_t.
               super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
               .super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>._M_head_impl;
      lVar2 = *(long *)pBVar6;
      pBVar6 = pBVar6 + *(long *)(lVar2 + -0x30);
      local_130 = (**(code **)(lVar2 + 0x38))();
      bidfx_public_api::price::subject::SubjectFactory::Fx();
      local_128 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
      bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Swap();
      psVar3 = (string *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Swap::LiquidityProvider
                         ((string *)local_b8);
      local_170[0] = local_160;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"CHFJPY","");
      psVar3 = (string *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Swap::CurrencyPair(psVar3);
      local_120[0] = local_110;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"CHF","");
      bidfx_public_api::price::subject::SubjectFactory::FX::Swap::Currency(psVar3);
      pTVar5 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Swap::NearQuantity
                                  (15000000.0);
      bidfx_public_api::price::subject::SubjectFactory::FX::Swap::NearTenor(pTVar5);
      pTVar5 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Swap::FarQuantity
                                  (15000000.0);
      puVar4 = (undefined8 *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Swap::FarTenor(pTVar5);
      (**(code **)*puVar4)(&local_78,puVar4);
      (**(code **)(*(long *)pBVar6 + 8))(pBVar6,&local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      if (local_120[0] != local_110) {
        operator_delete(local_120[0],local_110[0] + 1);
      }
      if (local_170[0] != local_160) {
        operator_delete(local_170[0],local_160[0] + 1);
      }
      local_f8 = __cxa_throw;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f0);
      pBVar6 = (local_100->subscriber_)._M_t.
               super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
               ._M_t.
               super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
               .super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>._M_head_impl;
      lVar2 = *(long *)pBVar6;
      pBVar6 = pBVar6 + *(long *)(lVar2 + -0x30);
      local_130 = (**(code **)(lVar2 + 0x38))();
      bidfx_public_api::price::subject::SubjectFactory::Fx();
      local_128 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
      bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Nds();
      psVar3 = (string *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Swap::LiquidityProvider
                         ((string *)local_b8);
      local_170[0] = local_160;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"USDCNY","");
      psVar3 = (string *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Swap::CurrencyPair(psVar3);
      local_120[0] = local_110;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"USD","");
      bidfx_public_api::price::subject::SubjectFactory::FX::Swap::Currency(psVar3);
      pTVar5 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Swap::NearQuantity
                                  (10000000.0);
      bidfx_public_api::price::subject::SubjectFactory::FX::Swap::NearTenor(pTVar5);
      pTVar5 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Swap::FarQuantity
                                  (8500000.0);
      puVar4 = (undefined8 *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Swap::FarTenor(pTVar5);
      (**(code **)*puVar4)(&local_90,puVar4);
      (**(code **)(*(long *)pBVar6 + 8))(pBVar6,&local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_90);
      if (local_120[0] != local_110) {
        operator_delete(local_120[0],local_110[0] + 1);
      }
      if (local_170[0] != local_160) {
        operator_delete(local_170[0],local_160[0] + 1);
      }
      local_f8 = __cxa_throw;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f0);
      if (local_150[0] != local_140) {
        operator_delete(local_150[0],local_140[0] + 1);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_98);
  }
  return;
}

Assistant:

void ApiExample::DealableQuotes(std::vector<std::string> liquidity_providers)
{
    for (std::string lp : liquidity_providers)
    {
        subscriber_->Subscribe(subscriber_->Subjects().Fx().Quote().Spot()
                .LiquidityProvider(lp)
                .CurrencyPair("EURUSD")
                .Currency("EUR")
                .Quantity(1000000.11)
                .CreateSubject());

        subscriber_->Subscribe(subscriber_->Subjects().Fx().Stream().Forward()
                .LiquidityProvider(lp)
                .CurrencyPair("EURUSD")
                .Currency("EUR")
                .Quantity(1000000)
                .Tenor(Tenor::IN_1_MONTH)
                .CreateSubject());

        subscriber_->Subscribe(subscriber_->Subjects().Fx().Stream().Swap()
                .LiquidityProvider(lp)
                .CurrencyPair("CHFJPY")
                .Currency("CHF")
                .NearQuantity(15000000)
                .NearTenor(Tenor::IN_3_MONTHS)
                .FarQuantity(15000000)
                .FarTenor(Tenor::IN_1_YEAR)
                .CreateSubject());

        subscriber_->Subscribe(subscriber_->Subjects().Fx().Stream().Nds()
                .LiquidityProvider(lp)
                .CurrencyPair("USDCNY")
                .Currency("USD")
                .NearQuantity(10000000)
                .NearTenor(Tenor::IN_1_YEAR)
                .FarQuantity(8500000)
                .FarTenor(Tenor::IN_3_YEARS)
                .CreateSubject());
    }
}